

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# person_debt.cpp
# Opt level: O2

void debts::showDebt(Debt *rd)

{
  pers::showPerson(&rd->name);
  std::operator<<((ostream *)&std::cout,": $");
}

Assistant:

void showDebt(const Debt & rd) {
        showPerson(rd.name);
        std::cout << ": $" << rd.amount << std::endl;
    }